

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexBuckets
          (DWARFVerifier *this,NameIndex *NI,DataExtractor *StrData)

{
  uint64_t uVar1;
  uint32_t uVar2;
  pointer pBVar3;
  raw_ostream *prVar4;
  ulong uVar5;
  pointer pBVar6;
  NameIndex *pNVar7;
  pointer pBVar8;
  pointer pBVar9;
  llvm *plVar10;
  char *pcVar11;
  ulong uVar12;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  *Params;
  uint uVar13;
  uint32_t uVar14;
  undefined1 auVar15 [4];
  ulong uVar16;
  undefined1 in_R8B;
  BucketInfo *pBVar17;
  _Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *this_00;
  pointer pBVar18;
  NameIndex *pNVar19;
  long lVar20;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  StringRef Buffer;
  StringRef Buffer_00;
  StringRef Fmt_03;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
  local_180;
  pointer local_f0;
  NameIndex *local_e8;
  undefined1 local_e0 [32];
  format_adapter local_c0;
  pointer local_b8;
  format_adapter local_b0;
  char **local_a8;
  format_adapter local_a0;
  uint64_t local_98;
  DWARFVerifier *local_90;
  uint local_88;
  uint32_t local_84;
  uint32_t FirstHash;
  uint32_t Hash;
  NameIndex *local_78;
  NameIndex *local_70;
  NameIndex *local_68;
  undefined8 local_60;
  uint32_t Bucket;
  pointer local_50;
  uint local_48;
  undefined1 local_44 [4];
  uint32_t NextUncovered;
  uint32_t Idx;
  pointer local_38;
  
  uVar2 = (NI->Hdr).super_HeaderPOD.BucketCount;
  if (uVar2 == 0) {
    prVar4 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xe67796,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
    local_e0._8_8_ = NI->Base;
    local_e0._0_8_ = &PTR_anchor_01078920;
    Fmt.Length = 0x32;
    Fmt.Data = "Name Index @ {0:x} does not contain a hash table.\n";
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
    formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
                    *)&local_180,Fmt,
                   (tuple<llvm::detail::provider_format_adapter<unsigned_long>_> *)local_e0);
    raw_ostream::operator<<(prVar4,&local_180.super_formatv_object_base);
    if (local_180.super_formatv_object_base.Replacements.
        super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.super_formatv_object_base.Replacements.
                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_180.super_formatv_object_base.Adapters.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.super_formatv_object_base.Adapters.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  uVar13 = uVar2 + 1;
  local_90 = this;
  local_68 = NI;
  if (uVar13 == 0) {
    local_60 = (llvm *)((ulong)local_60 & 0xffffffff00000000);
    local_50 = (pointer)CONCAT44(local_50._4_4_,0xffffffff);
    pBVar3 = (pointer)0x0;
    _Bucket = (pointer)0x0;
LAB_00d81e15:
    NI = (NameIndex *)0x0;
    _FirstHash = &PTR_anchor_010789b0;
    local_78 = (NameIndex *)&PTR_anchor_01078bf8;
    local_70 = (NameIndex *)&PTR_anchor_01078920;
    _NextUncovered = 0;
    pNVar19 = local_68;
    local_38 = pBVar3;
    do {
      local_48 = DWARFDebugNames::NameIndex::getBucketArrayEntry(pNVar19,(uint32_t)NI);
      if ((pNVar19->Hdr).super_HeaderPOD.NameCount < local_48) {
        prVar4 = WithColor::error((WithColor *)local_90->OS,(raw_ostream *)0xe67796,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        local_b8 = (pointer)pNVar19->Base;
        local_e0._0_8_ = _FirstHash;
        local_e0._8_4_ = (pNVar19->Hdr).super_HeaderPOD.NameCount;
        local_e0._16_8_ = local_78;
        local_e0._24_8_ = &local_48;
        local_c0._vptr_format_adapter = (_func_int **)local_70;
        local_b0._vptr_format_adapter = (_func_int **)local_78;
        local_a8 = (char **)&local_60;
        Fmt_00.Length = 0x56;
        Fmt_00.Data = 
        "Bucket {0} of Name Index @ {1:x} contains invalid value {2}. Valid range is [0, {3}].\n";
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
        ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                          *)&local_180,Fmt_00,
                         (tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                          *)local_e0);
        raw_ostream::operator<<(prVar4,&local_180.super_formatv_object_base);
        if (local_180.super_formatv_object_base.Replacements.
            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_180.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _NextUncovered = (ulong)((int)_NextUncovered + 1);
      }
      else if (local_48 != 0) {
        if (pBVar3 == _Bucket) {
          uVar16 = (long)pBVar3 - (long)local_38;
          if (uVar16 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar5 = (long)uVar16 >> 3;
          uVar12 = uVar5;
          if (pBVar3 == local_38) {
            uVar12 = 1;
          }
          this_00 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)(uVar12 + uVar5);
          if ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0xffffffffffffffe < this_00)
          {
            this_00 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0xfffffffffffffff;
          }
          if (CARRY8(uVar12,uVar5)) {
            this_00 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0xfffffffffffffff;
          }
          _Bucket = pBVar3;
          pBVar18 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                              (this_00,0xfffffffffffffff);
          *(uint32_t *)((long)pBVar18 + uVar16) = (uint32_t)local_60;
          *(uint *)((long)pBVar18 + uVar16 + 4) = local_48;
          pBVar17 = pBVar18;
          for (pBVar6 = local_38; pBVar3 != pBVar6; pBVar6 = pBVar6 + 1) {
            *pBVar17 = *pBVar6;
            pBVar17 = pBVar17 + 1;
          }
          if (local_38 != (pointer)0x0) {
            operator_delete(local_38,uVar16);
          }
          pBVar3 = pBVar17 + 1;
          _Bucket = pBVar18 + (long)this_00;
          pNVar19 = local_68;
          local_38 = pBVar18;
        }
        else {
          pBVar3->Bucket = (uint32_t)local_60;
          pBVar3->Index = local_48;
          pBVar3 = pBVar3 + 1;
        }
      }
      uVar13 = (uint32_t)local_60 + 1;
      NI = (NameIndex *)(ulong)uVar13;
      local_60 = (llvm *)CONCAT44(local_60._4_4_,uVar13);
    } while (uVar13 < (uint)local_50);
    uVar13 = (uint)_NextUncovered;
    if (uVar13 != 0) goto LAB_00d82597;
  }
  else {
    _Bucket = (pointer)0x0;
    pBVar3 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                       ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)(ulong)uVar13,
                        (size_t)NI);
    _Bucket = pBVar3 + (long)(ulong)uVar13;
    uVar2 = (local_68->Hdr).super_HeaderPOD.BucketCount;
    local_60 = (llvm *)((ulong)local_60._4_4_ << 0x20);
    local_50 = (pointer)CONCAT44(local_50._4_4_,uVar2);
    local_38 = pBVar3;
    if (uVar2 != 0) goto LAB_00d81e15;
  }
  lVar20 = (long)pBVar3 - (long)local_38;
  pNVar19 = (NameIndex *)(lVar20 >> 3);
  if (1 < (long)pNVar19) {
    NI = pNVar19;
    qsort(local_38,(size_t)pNVar19,8,
          array_pod_sort_comparator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>
         );
  }
  pBVar6 = _Bucket;
  uVar2 = (local_68->Hdr).super_HeaderPOD.BucketCount;
  uVar14 = (local_68->Hdr).super_HeaderPOD.NameCount + 1;
  if (pBVar3 == _Bucket) {
    _NextUncovered = CONCAT44(Idx,uVar2);
    if (lVar20 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    pNVar7 = (NameIndex *)0x1;
    if (_Bucket != local_38) {
      pNVar7 = pNVar19;
    }
    pBVar18 = (pointer)((long)(&(pNVar19->Hdr).AugmentationString + -1) + (long)(&pNVar7->Hdr + -1))
    ;
    if ((pointer)0xffffffffffffffe < pBVar18) {
      pBVar18 = (pointer)0xfffffffffffffff;
    }
    if (CARRY8((ulong)pNVar7,(ulong)pNVar19)) {
      pBVar18 = (pointer)0xfffffffffffffff;
    }
    pBVar8 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                       ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)pBVar18,(size_t)NI)
    ;
    pNVar19 = local_68;
    *(uint32_t *)((long)pBVar8 + lVar20) = NextUncovered;
    *(uint32_t *)((long)pBVar8 + lVar20 + 4) = uVar14;
    uVar16 = (long)pBVar6 - (long)local_38;
    pBVar9 = local_38;
    pBVar3 = pBVar8;
    if (uVar16 != 0) {
      do {
        *pBVar3 = *pBVar9;
        pBVar9 = pBVar9 + 1;
        pBVar3 = pBVar3 + 1;
      } while (pBVar9 != pBVar6);
    }
    local_50 = pBVar18;
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,uVar16);
    }
    _Bucket = pBVar8 + (long)local_50;
  }
  else {
    pBVar3->Bucket = uVar2;
    pBVar3->Index = uVar14;
    pBVar8 = local_38;
    pNVar19 = local_68;
  }
  local_48 = 1;
  local_f0 = pBVar3;
  local_38 = pBVar8;
  if (pBVar8 == pBVar3 + 1) {
    _NextUncovered = 0;
  }
  else {
    _NextUncovered = 0;
    _FirstHash = &PTR_anchor_010789b0;
    local_78 = (NameIndex *)&PTR_anchor_01078bf8;
    local_70 = (NameIndex *)&PTR_anchor_01078920;
    local_68 = (NameIndex *)&PTR_anchor_01078c28;
    local_e8 = (NameIndex *)&PTR_anchor_01078950;
    do {
      uVar2 = pBVar8->Index;
      local_50 = pBVar8;
      if (local_48 < uVar2) {
        prVar4 = WithColor::error((WithColor *)local_90->OS,(raw_ostream *)0xe67796,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        local_b8 = (pointer)pNVar19->Base;
        local_e0._0_8_ = _FirstHash;
        local_e0._8_4_ = local_50->Index - 1;
        local_e0._16_8_ = local_78;
        local_e0._24_8_ = &local_48;
        local_c0._vptr_format_adapter = (_func_int **)local_70;
        Fmt_01.Length = 0x55;
        Fmt_01.Data = 
        "Name Index @ {0:x}: Name table entries [{1}, {2}] are not covered by the hash table.\n";
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
        ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                          *)&local_180,Fmt_01,
                         (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                          *)local_e0);
        raw_ostream::operator<<(prVar4,&local_180.super_formatv_object_base);
        if (local_180.super_formatv_object_base.Replacements.
            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_180.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _NextUncovered = (ulong)((int)_NextUncovered + 1);
        uVar2 = local_50->Index;
      }
      Params = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                *)(ulong)local_50->Bucket;
      local_44 = (undefined1  [4])uVar2;
      if (local_50->Bucket == (pNVar19->Hdr).super_HeaderPOD.BucketCount) break;
      local_88 = DWARFDebugNames::NameIndex::getHashArrayEntry(pNVar19,uVar2);
      if (local_88 % (pNVar19->Hdr).super_HeaderPOD.BucketCount != local_50->Bucket) {
        prVar4 = WithColor::error((WithColor *)local_90->OS,(raw_ostream *)0xe67796,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        local_a8 = (char **)pNVar19->Base;
        local_e0._0_8_ = _FirstHash;
        local_e0._8_4_ = local_88 % (pNVar19->Hdr).super_HeaderPOD.BucketCount;
        local_e0._16_8_ = local_78;
        local_e0._24_8_ = &local_88;
        local_c0._vptr_format_adapter = (_func_int **)local_e8;
        local_b8 = local_50;
        local_b0._vptr_format_adapter = (_func_int **)local_70;
        Params = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                  *)local_e0;
        Fmt_02.Length = 0x73;
        Fmt_02.Data = 
        "Name Index @ {0:x}: Bucket {1} is not empty but points to a mismatched hash value {2:x} (belonging to bucket {3}).\n"
        ;
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
        ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                          *)&local_180,Fmt_02,
                         (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                          *)Params);
        raw_ostream::operator<<(prVar4,&local_180.super_formatv_object_base);
        if (local_180.super_formatv_object_base.Replacements.
            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_180.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _NextUncovered = (ulong)((int)_NextUncovered + 1);
      }
      while (((uint)local_44 <= (pNVar19->Hdr).super_HeaderPOD.NameCount &&
             (local_84 = DWARFDebugNames::NameIndex::getHashArrayEntry(pNVar19,(uint32_t)local_44),
             local_84 % (pNVar19->Hdr).super_HeaderPOD.BucketCount == local_50->Bucket))) {
        DWARFDebugNames::NameIndex::getNameTableEntry
                  ((NameTableEntry *)&local_180,pNVar19,(uint32_t)local_44);
        local_e0._0_8_ =
             local_180.super_formatv_object_base.Adapters.
             super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        plVar10 = (llvm *)DataExtractor::getCStr((DataExtractor *)&local_180,(uint64_t *)local_e0);
        local_60 = plVar10;
        if (plVar10 == (llvm *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          pcVar11 = (char *)strlen((char *)plVar10);
        }
        Buffer.Length = 0x1505;
        Buffer.Data = pcVar11;
        uVar2 = caseFoldingDjbHash(plVar10,Buffer,(uint32_t)Params);
        if (uVar2 != local_84) {
          uVar2 = 0;
          prVar4 = WithColor::error((WithColor *)local_90->OS,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          plVar10 = local_60;
          uVar1 = pNVar19->Base;
          if (local_60 == (llvm *)0x0) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11 = (char *)strlen((char *)local_60);
          }
          Buffer_00.Length = 0x1505;
          Buffer_00.Data = pcVar11;
          uVar2 = caseFoldingDjbHash(plVar10,Buffer_00,uVar2);
          local_e0._0_8_ = local_78;
          local_e0._8_8_ = &local_84;
          local_e0._16_8_ = _FirstHash;
          local_e0._24_4_ = uVar2;
          local_c0._vptr_format_adapter = (_func_int **)local_78;
          local_b8 = (pointer)local_44;
          local_b0._vptr_format_adapter = (_func_int **)local_68;
          local_a8 = (char **)&local_60;
          local_a0._vptr_format_adapter = (_func_int **)local_70;
          Params = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                    *)local_e0;
          Fmt_03.Length = 0x60;
          Fmt_03.Data = 
          "Name Index @ {0:x}: String ({1}) at index {2} hashes to {3:x}, but the Name Index hash is {4:x}\n"
          ;
          local_98 = uVar1;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
          ::formatv_object(&local_180,Fmt_03,Params);
          raw_ostream::operator<<(prVar4,&local_180.super_formatv_object_base);
          if (local_180.super_formatv_object_base.Replacements.
              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_180.super_formatv_object_base.Replacements.
                                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.super_formatv_object_base.Replacements.
                                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_180.super_formatv_object_base.Adapters.
              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_180.super_formatv_object_base.Adapters.
                                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.super_formatv_object_base.Adapters.
                                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          _NextUncovered = (ulong)((int)_NextUncovered + 1);
        }
        local_44 = (undefined1  [4])((int)local_44 + 1);
      }
      auVar15 = local_44;
      if ((uint)local_44 < local_48) {
        auVar15 = (undefined1  [4])local_48;
      }
      pBVar8 = local_50 + 1;
      local_48 = (uint)auVar15;
    } while (local_50 != local_f0);
  }
  uVar13 = (uint)_NextUncovered;
LAB_00d82597:
  if (local_38 != (pointer)0x0) {
    operator_delete(local_38,(long)_Bucket - (long)local_38);
  }
  return uVar13;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexBuckets(const DWARFDebugNames::NameIndex &NI,
                                      const DataExtractor &StrData) {
  struct BucketInfo {
    uint32_t Bucket;
    uint32_t Index;

    constexpr BucketInfo(uint32_t Bucket, uint32_t Index)
        : Bucket(Bucket), Index(Index) {}
    bool operator<(const BucketInfo &RHS) const { return Index < RHS.Index; };
  };

  uint32_t NumErrors = 0;
  if (NI.getBucketCount() == 0) {
    warn() << formatv("Name Index @ {0:x} does not contain a hash table.\n",
                      NI.getUnitOffset());
    return NumErrors;
  }

  // Build up a list of (Bucket, Index) pairs. We use this later to verify that
  // each Name is reachable from the appropriate bucket.
  std::vector<BucketInfo> BucketStarts;
  BucketStarts.reserve(NI.getBucketCount() + 1);
  for (uint32_t Bucket = 0, End = NI.getBucketCount(); Bucket < End; ++Bucket) {
    uint32_t Index = NI.getBucketArrayEntry(Bucket);
    if (Index > NI.getNameCount()) {
      error() << formatv("Bucket {0} of Name Index @ {1:x} contains invalid "
                         "value {2}. Valid range is [0, {3}].\n",
                         Bucket, NI.getUnitOffset(), Index, NI.getNameCount());
      ++NumErrors;
      continue;
    }
    if (Index > 0)
      BucketStarts.emplace_back(Bucket, Index);
  }

  // If there were any buckets with invalid values, skip further checks as they
  // will likely produce many errors which will only confuse the actual root
  // problem.
  if (NumErrors > 0)
    return NumErrors;

  // Sort the list in the order of increasing "Index" entries.
  array_pod_sort(BucketStarts.begin(), BucketStarts.end());

  // Insert a sentinel entry at the end, so we can check that the end of the
  // table is covered in the loop below.
  BucketStarts.emplace_back(NI.getBucketCount(), NI.getNameCount() + 1);

  // Loop invariant: NextUncovered is the (1-based) index of the first Name
  // which is not reachable by any of the buckets we processed so far (and
  // hasn't been reported as uncovered).
  uint32_t NextUncovered = 1;
  for (const BucketInfo &B : BucketStarts) {
    // Under normal circumstances B.Index be equal to NextUncovered, but it can
    // be less if a bucket points to names which are already known to be in some
    // bucket we processed earlier. In that case, we won't trigger this error,
    // but report the mismatched hash value error instead. (We know the hash
    // will not match because we have already verified that the name's hash
    // puts it into the previous bucket.)
    if (B.Index > NextUncovered) {
      error() << formatv("Name Index @ {0:x}: Name table entries [{1}, {2}] "
                         "are not covered by the hash table.\n",
                         NI.getUnitOffset(), NextUncovered, B.Index - 1);
      ++NumErrors;
    }
    uint32_t Idx = B.Index;

    // The rest of the checks apply only to non-sentinel entries.
    if (B.Bucket == NI.getBucketCount())
      break;

    // This triggers if a non-empty bucket points to a name with a mismatched
    // hash. Clients are likely to interpret this as an empty bucket, because a
    // mismatched hash signals the end of a bucket, but if this is indeed an
    // empty bucket, the producer should have signalled this by marking the
    // bucket as empty.
    uint32_t FirstHash = NI.getHashArrayEntry(Idx);
    if (FirstHash % NI.getBucketCount() != B.Bucket) {
      error() << formatv(
          "Name Index @ {0:x}: Bucket {1} is not empty but points to a "
          "mismatched hash value {2:x} (belonging to bucket {3}).\n",
          NI.getUnitOffset(), B.Bucket, FirstHash,
          FirstHash % NI.getBucketCount());
      ++NumErrors;
    }

    // This find the end of this bucket and also verifies that all the hashes in
    // this bucket are correct by comparing the stored hashes to the ones we
    // compute ourselves.
    while (Idx <= NI.getNameCount()) {
      uint32_t Hash = NI.getHashArrayEntry(Idx);
      if (Hash % NI.getBucketCount() != B.Bucket)
        break;

      const char *Str = NI.getNameTableEntry(Idx).getString();
      if (caseFoldingDjbHash(Str) != Hash) {
        error() << formatv("Name Index @ {0:x}: String ({1}) at index {2} "
                           "hashes to {3:x}, but "
                           "the Name Index hash is {4:x}\n",
                           NI.getUnitOffset(), Str, Idx,
                           caseFoldingDjbHash(Str), Hash);
        ++NumErrors;
      }

      ++Idx;
    }
    NextUncovered = std::max(NextUncovered, Idx);
  }
  return NumErrors;
}